

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Queries::FunctionalTest::prepareQueries(FunctionalTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  GLuint *pGVar4;
  undefined4 *puVar5;
  uint local_1c;
  GLuint i;
  Functions *gl;
  FunctionalTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  pGVar4 = (GLuint *)operator_new__(0x10);
  this->m_qo = pGVar4;
  if (this->m_qo == (GLuint *)0x0) {
    puVar5 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar5 = 0;
    __cxa_throw(puVar5,&int::typeinfo,0);
  }
  local_1c = 0;
  while( true ) {
    if (3 < local_1c) {
      return;
    }
    (**(code **)(lVar3 + 0x3d8))
              (*(undefined4 *)(s_targets + (ulong)local_1c * 4),1,this->m_qo + local_1c);
    iVar1 = (**(code **)(lVar3 + 0x800))();
    if (iVar1 != 0) break;
    local_1c = local_1c + 1;
  }
  if (local_1c != 0) {
    (**(code **)(lVar3 + 0x458))(local_1c,this->m_qo);
  }
  if (this->m_qo != (GLuint *)0x0) {
    operator_delete__(this->m_qo);
  }
  this->m_qo = (GLuint *)0x0;
  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar5 = 0;
  __cxa_throw(puVar5,&int::typeinfo,0);
}

Assistant:

void FunctionalTest::prepareQueries()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Allocating memory for queries array. */
	m_qo = new glw::GLuint[s_targets_count];

	if (DE_NULL == m_qo)
	{
		throw 0;
	}

	/* Creating query object for each target. */
	for (glw::GLuint i = 0; i < s_targets_count; ++i)
	{
		gl.createQueries(s_targets[i], 1, &m_qo[i]);

		/* Error checking. */
		if (GL_NO_ERROR != gl.getError())
		{
			/* Remove previous. */
			if (i > 0)
			{
				gl.deleteQueries(i, m_qo);
			}

			/* Deallocate storage. */
			delete[] m_qo;

			m_qo = DE_NULL;

			/* Signalise test failure. */
			throw 0;
		}
	}
}